

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

void __thiscall
QMakeParser::finalizeCall(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int argc)

{
  ushort uVar1;
  char16_t *pcVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  ProFile *pPVar7;
  ushort *puVar8;
  size_t sVar9;
  iterator iVar10;
  ushort *puVar11;
  ushort uVar12;
  storage_type *psVar13;
  QMakeParser *pQVar14;
  ulong uVar15;
  long lVar16;
  long in_FS_OFFSET;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QByteArrayView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QAnyStringView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QAnyStringView QVar33;
  QStringView QVar34;
  QByteArrayView QVar35;
  QAnyStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QArrayData *local_70 [3];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*uc != 9) || (uVar15 = (ulong)uc[3], uc[uVar15 + 4] != 0x11)) {
LAB_00292a46:
    finalizeTest(this,tokPtr);
    memcpy(*tokPtr,uc,(long)ptr - (long)uc & 0xffffffff);
    *tokPtr = (ushort *)((long)*tokPtr + ((long)ptr - (long)uc & 0x1fffffffeU));
    goto LAB_00292a6f;
  }
  puVar8 = uc + uVar15 + 5;
  QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + 4));
  pcVar2 = (this->m_tmp).d.ptr;
  lVar16 = (this->m_tmp).d.size;
  if ((lVar16 == (anonymous_namespace)::statics._40_8_) &&
     (QVar17.m_data = pcVar2, QVar17.m_size = lVar16,
     QVar37.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._32_8_,
     QVar37.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar17,QVar37), cVar3 != '\0')) {
    if (this->m_operator == AndOperator) {
      this->m_operator = NoOperator;
    }
    bVar4 = failOperator(this,"in front of for()");
    if (bVar4) {
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
LAB_0029285b:
      bogusTest(this,tokPtr,&local_58);
    }
    else {
      pQVar14 = this;
      flushCond(this,tokPtr);
      iVar6 = this->m_markLine;
      if (iVar6 != 0) {
        puVar11 = *tokPtr;
        *puVar11 = 1;
        *tokPtr = puVar11 + 2;
        puVar11[1] = (ushort)iVar6;
        this->m_markLine = 0;
      }
      if (*puVar8 == 0x208) {
        uVar1 = uc[uVar15 + 6];
        if (uc + uVar15 + (ulong)uVar1 + 7 == ptr + -1) {
          puVar8 = *tokPtr;
          *tokPtr = puVar8 + 1;
          *puVar8 = 0x19;
          pQVar14 = (QMakeParser *)0x0;
          sVar9 = ProString::hash((QChar *)0x0,0);
          puVar8 = *tokPtr;
          *puVar8 = (ushort)sVar9;
          puVar8[1] = (ushort)(sVar9 >> 0x10);
          puVar8[2] = 0;
          *(uint *)(puVar8 + 3) = uVar1 + 5;
          *tokPtr = puVar8 + 6;
          puVar8[5] = 9;
          putHashStr(pQVar14,tokPtr,uc + uVar15 + 7,(uint)uVar1);
          puVar8 = *tokPtr;
          goto LAB_00292eb1;
        }
        if ((argc == 2) && (uc[uVar15 + (ulong)uVar1 + 7] == 0xe)) {
          puVar8 = uc + uVar15 + (ulong)uVar1 + 8;
          puVar11 = *tokPtr;
          *tokPtr = puVar11 + 1;
          *puVar11 = 0x19;
          putHashStr(pQVar14,tokPtr,uc + uVar15 + 7,(uint)uVar1);
          puVar11 = *tokPtr;
          goto LAB_00292c9b;
        }
      }
      else if (argc == 1) {
        puVar11 = *tokPtr;
        *tokPtr = puVar11 + 1;
        *puVar11 = 0x19;
        sVar9 = ProString::hash((QChar *)0x0,0);
        puVar11 = *tokPtr;
        *puVar11 = (ushort)sVar9;
        puVar11[1] = (ushort)(sVar9 >> 0x10);
        puVar11[2] = 0;
        puVar11 = puVar11 + 3;
LAB_00292c9b:
        uVar15 = (long)(ptr + -1) - (long)puVar8;
        iVar6 = (int)(uVar15 >> 1) + 1;
        *puVar11 = (ushort)iVar6;
        *tokPtr = puVar11 + 2;
        puVar11[1] = (ushort)((uint)iVar6 >> 0x10);
        memcpy(puVar11 + 2,puVar8,uVar15 & 0xffffffff);
        puVar8 = (ushort *)((uVar15 & 0x1fffffffe) + (long)*tokPtr);
LAB_00292eb1:
        *tokPtr = puVar8 + 1;
        *puVar8 = 7;
        enterScope(this,tokPtr,true,StCtrl);
        iVar10 = QList<QMakeParser::BlockScope>::end
                           (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
        iVar10.i[-1].nest = iVar10.i[-1].nest | 1;
        goto LAB_00292a6f;
      }
      psVar13 = (storage_type *)0x39;
LAB_00292ce8:
      QVar30.m_data = psVar13;
      QVar30.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar30);
      message(this,0x301,&local_58);
      this->m_proFile->m_ok = false;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      local_70[0] = &(local_58.d.d)->super_QArrayData;
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00292de0:
        QArrayData::deallocate(local_70[0],2,0x10);
      }
    }
  }
  else {
    if ((lVar16 != (anonymous_namespace)::statics._88_8_) ||
       (QVar18.m_data = pcVar2, QVar18.m_size = lVar16,
       QVar38.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._80_8_,
       QVar38.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar18,QVar38), cVar3 == '\0')) {
      if ((lVar16 == (anonymous_namespace)::statics._64_8_) &&
         (QVar19.m_data = pcVar2, QVar19.m_size = lVar16,
         QVar39.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._56_8_,
         QVar39.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar19,QVar39), cVar3 != '\0')) {
        uVar12 = 0x1a;
        lVar16 = 0x2e5880;
        goto LAB_00292832;
      }
      if ((lVar16 == (anonymous_namespace)::statics._112_8_) &&
         (QVar21.m_data = pcVar2, QVar21.m_size = lVar16,
         QVar40.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._104_8_,
         QVar40.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar21,QVar40), cVar3 != '\0')) {
        if (*puVar8 == 0xf) {
          iVar10 = QList<QMakeParser::BlockScope>::end
                             (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((iVar10.i[-1].nest & 2) == 0) {
            psVar13 = (storage_type *)0x10;
          }
          else {
            if (this->m_invert == 0) {
              flushScopes(this,tokPtr);
              iVar6 = this->m_markLine;
              if (iVar6 != 0) {
                puVar8 = *tokPtr;
                *puVar8 = 1;
                *tokPtr = puVar8 + 2;
                puVar8[1] = (ushort)iVar6;
                this->m_markLine = 0;
              }
              if (this->m_operator == OrOperator) {
                uVar12 = 0x17;
LAB_00293033:
                puVar8 = *tokPtr;
                *tokPtr = puVar8 + 1;
                *puVar8 = uVar12;
LAB_00293040:
                this->m_operator = NoOperator;
              }
              else if (this->m_operator == AndOperator) {
                uVar12 = 0x16;
                if (this->m_state == StCond) goto LAB_00293033;
                goto LAB_00293040;
              }
              puVar8 = *tokPtr;
              *tokPtr = puVar8 + 1;
              *puVar8 = 0x1c;
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                enterScope(this,tokPtr,true,StCtrl);
                return;
              }
              goto LAB_002930fc;
            }
            psVar13 = (storage_type *)0x29;
          }
        }
        else {
LAB_00292bb1:
          psVar13 = (storage_type *)0x1d;
        }
        QVar26.m_data = psVar13;
        QVar26.m_size = (qsizetype)local_70;
        QString::fromLatin1(QVar26);
        QVar27.m_size = (size_t)local_70;
        QVar27.field_0.m_data = &local_58;
        QString::arg_impl(QVar27,(int)(this->m_tmp).d.ptr,(QChar)(char16_t)(this->m_tmp).d.size);
LAB_00292d98:
        bogusTest(this,tokPtr,&local_58);
        goto LAB_00292da6;
      }
      if ((lVar16 == (anonymous_namespace)::statics._160_8_) &&
         (QVar22.m_data = pcVar2, QVar22.m_size = lVar16,
         QVar41.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._152_8_,
         QVar41.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar22,QVar41), cVar3 != '\0')) {
        iVar10 = QList<QMakeParser::BlockScope>::end
                           (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
        if ((iVar10.i[-1].nest & 2) == 0) {
          uVar12 = 0x12;
          if (*puVar8 != 0xf) {
            psVar13 = (storage_type *)0x2b;
LAB_00292d36:
            QVar31.m_data = psVar13;
            QVar31.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar31);
            goto LAB_0029285b;
          }
        }
        else {
          uVar12 = 0x12;
          if (1 < argc) {
            psVar13 = (storage_type *)0x27;
            goto LAB_00292d36;
          }
        }
LAB_00292d46:
        if (this->m_invert == 0) {
          finalizeTest(this,tokPtr);
          iVar6 = (int)((ulong)((long)ptr - (long)puVar8) >> 1);
          memcpy(*tokPtr,puVar8,(ulong)(iVar6 * 2 - 2));
          puVar8 = *tokPtr;
          *tokPtr = puVar8 + (iVar6 - 1) + 1;
          puVar8[iVar6 - 1] = uVar12;
          goto LAB_00292a6f;
        }
        psVar13 = (storage_type *)0x29;
LAB_00292d62:
        QVar32.m_data = psVar13;
        QVar32.m_size = (qsizetype)local_70;
        QString::fromLatin1(QVar32);
        QVar33.m_size = (size_t)local_70;
        QVar33.field_0.m_data = &local_58;
        QString::arg_impl(QVar33,(int)(this->m_tmp).d.ptr,(QChar)(char16_t)(this->m_tmp).d.size);
        goto LAB_00292d98;
      }
      if (lVar16 == (anonymous_namespace)::statics._184_8_) {
        QVar23.m_data = pcVar2;
        QVar23.m_size = lVar16;
        QVar42.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._176_8_;
        QVar42.m_size = lVar16;
        cVar3 = QtPrivate::equalStrings(QVar23,QVar42);
        uVar12 = 0x14;
        if (cVar3 == '\0') goto LAB_0029297b;
LAB_002929a6:
        if (*puVar8 != 0xf) goto LAB_00292bb1;
        iVar10 = QList<QMakeParser::BlockScope>::end
                           (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
        if ((iVar10.i[-1].nest & 1) != 0) goto LAB_00292d46;
        psVar13 = (storage_type *)0x10;
        goto LAB_00292d62;
      }
LAB_0029297b:
      if (lVar16 == (anonymous_namespace)::statics._208_8_) {
        QVar24.m_data = pcVar2;
        QVar24.m_size = lVar16;
        QVar43.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._200_8_;
        QVar43.m_size = lVar16;
        cVar3 = QtPrivate::equalStrings(QVar24,QVar43);
        uVar12 = 0x13;
        if (cVar3 != '\0') goto LAB_002929a6;
      }
      if ((lVar16 != (anonymous_namespace)::statics._136_8_) ||
         (QVar25.m_data = pcVar2, QVar25.m_size = lVar16,
         QVar44.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._128_8_,
         QVar44.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar25,QVar44), cVar3 == '\0'))
      goto LAB_00292a46;
      if ((this->m_state == StNew) &&
         ((((iVar10 = QList<QMakeParser::BlockScope>::end
                                (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>),
            iVar10.i[-1].braceLevel == 0 &&
            ((ulong)(this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size < 2)) &&
           (this->m_invert == 0)) && (this->m_operator == NoOperator)))) {
        if ((*puVar8 != 0x208) || (uc[uVar15 + (ulong)uc[uVar15 + 6] + 7] != 0xf)) {
          psVar13 = (storage_type *)0x27;
          goto LAB_00292ce8;
        }
        QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + uVar15 + 7));
        lVar16 = (this->m_tmp).d.size;
        if ((lVar16 == (anonymous_namespace)::statics._232_8_) &&
           (QVar34.m_data = (this->m_tmp).d.ptr, QVar34.m_size = lVar16,
           QVar45.m_data = (storage_type_conflict *)(anonymous_namespace)::statics._224_8_,
           QVar45.m_size = lVar16, cVar3 = QtPrivate::equalStrings(QVar34,QVar45), cVar3 != '\0')) {
          this->m_proFile->m_hostBuild = true;
          goto LAB_00292a6f;
        }
        QVar35.m_data = (storage_type *)0x14;
        QVar35.m_size = (qsizetype)local_70;
        QString::fromLatin1(QVar35);
        QVar36.m_size = (size_t)local_70;
        QVar36.field_0.m_data = &local_58;
        QString::arg_impl(QVar36,(int)(this->m_tmp).d.ptr,(QChar)(char16_t)(this->m_tmp).d.size);
        message(this,0x301,&local_58);
        pPVar7 = this->m_proFile;
        goto LAB_00292c5a;
      }
      psVar13 = (storage_type *)0x34;
LAB_0029284d:
      QVar20.m_data = psVar13;
      QVar20.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar20);
      goto LAB_0029285b;
    }
    uVar12 = 0x1b;
    lVar16 = 0x2e5898;
LAB_00292832:
    if (this->m_invert != 0) {
      psVar13 = (storage_type *)0x38;
      goto LAB_0029284d;
    }
    pQVar14 = this;
    flushScopes(this,tokPtr);
    iVar6 = this->m_markLine;
    if (iVar6 != 0) {
      puVar11 = *tokPtr;
      *puVar11 = 1;
      *tokPtr = puVar11 + 2;
      puVar11[1] = (ushort)iVar6;
      this->m_markLine = 0;
    }
    if ((*puVar8 != 0x208) || (uVar1 = uc[uVar15 + 6], uc[uVar15 + (ulong)uVar1 + 7] != 0xf)) {
      QVar28.m_data = (storage_type *)0x2b;
      QVar28.m_size = (qsizetype)local_70;
      QString::fromLatin1(QVar28);
      QVar29.m_size = (size_t)local_70;
      QVar29.field_0.m_data = &local_58;
      QString::arg_impl(QVar29,(int)*(undefined8 *)(lVar16 + 8),
                        (QChar)(char16_t)*(undefined8 *)(lVar16 + 0x10));
      message(this,0x301,&local_58);
      pPVar7 = this->m_proFile;
LAB_00292c5a:
      pPVar7->m_ok = false;
LAB_00292da6:
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_70[0] == (QArrayData *)0x0) goto LAB_00292a6f;
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_00292a6f;
      goto LAB_00292de0;
    }
    if (this->m_operator == OrOperator) {
      uVar5 = 0x17;
LAB_00292ef0:
      pQVar14 = (QMakeParser *)*tokPtr;
      *tokPtr = (ushort *)((long)&pQVar14->m_proFile + 2);
      *(ushort *)&pQVar14->m_proFile = uVar5;
LAB_00292efd:
      this->m_operator = NoOperator;
    }
    else if (this->m_operator == AndOperator) {
      uVar5 = 0x16;
      if (this->m_state == StCond) goto LAB_00292ef0;
      goto LAB_00292efd;
    }
    puVar8 = *tokPtr;
    *tokPtr = puVar8 + 1;
    *puVar8 = uVar12;
    putHashStr(pQVar14,tokPtr,uc + uVar15 + 7,(uint)uVar1);
    enterScope(this,tokPtr,true,StCtrl);
    iVar10 = QList<QMakeParser::BlockScope>::end
                       (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
    iVar10.i[-1].nest = '\x02';
  }
LAB_00292a6f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002930fc:
  __stack_chk_fail();
}

Assistant:

void QMakeParser::finalizeCall(ushort *&tokPtr, ushort *uc, ushort *ptr, int argc)
{
    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (*uce == TokTestCall) {
            uce++;
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            const QString *defName;
            ushort defType;
            if (m_tmp == statics.strfor) {
                if (!acceptColon("in front of for()")) {
                    bogusTest(tokPtr, QString());
                    return;
                }
                flushCond(tokPtr);
                putLineMarker(tokPtr);
                --ptr;
                Q_ASSERT(*ptr == TokFuncTerminator);
                if (*uce == (TokLiteral|TokNewStr)) {
                    nlen = uce[1];
                    uc = uce + 2 + nlen;
                    if (uc == ptr) {
                        // for(literal) (only "ever" would be legal if qmake was sane)
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, nullptr, (uint)0);
                        putBlockLen(tokPtr, 1 + 3 + nlen + 1);
                        putTok(tokPtr, TokHashLiteral);
                        putHashStr(tokPtr, uce + 2, nlen);
                      didFor:
                        putTok(tokPtr, TokValueTerminator);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest |= NestLoop;
                        return;
                    } else if (*uc == TokArgSeparator && argc == 2) {
                        // for(var, something)
                        uc++;
                        putTok(tokPtr, TokForLoop);
                        putHashStr(tokPtr, uce + 2, nlen);
                      doFor:
                        nlen = ptr - uc;
                        putBlockLen(tokPtr, nlen + 1);
                        putBlock(tokPtr, uc, nlen);
                        goto didFor;
                    }
                } else if (argc == 1) {
                    // for(non-literal) (this wouldn't be here if qmake was sane)
                    putTok(tokPtr, TokForLoop);
                    putHashStr(tokPtr, nullptr, (uint)0);
                    uc = uce;
                    goto doFor;
                }
                parseError(fL1S("Syntax is for(var, list), for(var, forever) or for(ever)."));
                return;
            } else if (m_tmp == statics.strdefineReplace) {
                defName = &statics.strdefineReplace;
                defType = TokReplaceDef;
                goto deffunc;
            } else if (m_tmp == statics.strdefineTest) {
                defName = &statics.strdefineTest;
                defType = TokTestDef;
              deffunc:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of function definition."));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        putOperator(tokPtr);
                        putTok(tokPtr, defType);
                        putHashStr(tokPtr, uce + 2, nlen);
                        enterScope(tokPtr, true, StCtrl);
                        m_blockstack.top().nest = NestFunction;
                        return;
                    }
                }
                parseError(fL1S("%1(function) requires one literal argument.").arg(*defName));
                return;
            } else if (m_tmp == statics.strbypassNesting) {
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestFunction)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                flushScopes(tokPtr);
                putLineMarker(tokPtr);
                putOperator(tokPtr);
                putTok(tokPtr, TokBypassNesting);
                enterScope(tokPtr, true, StCtrl);
                return;
            } else if (m_tmp == statics.strreturn) {
                if (m_blockstack.top().nest & NestFunction) {
                    if (argc > 1) {
                        bogusTest(tokPtr, fL1S("return() requires zero or one argument."));
                        return;
                    }
                } else {
                    if (*uce != TokFuncTerminator) {
                        bogusTest(tokPtr, fL1S("Top-level return() requires zero arguments."));
                        return;
                    }
                }
                defType = TokReturn;
                goto ctrlstm2;
            } else if (m_tmp == statics.strnext) {
                defType = TokNext;
                goto ctrlstm;
            } else if (m_tmp == statics.strbreak) {
                defType = TokBreak;
              ctrlstm:
                if (*uce != TokFuncTerminator) {
                    bogusTest(tokPtr, fL1S("%1() requires zero arguments.").arg(m_tmp));
                    return;
                }
                if (!(m_blockstack.top().nest & NestLoop)) {
                    bogusTest(tokPtr, fL1S("Unexpected %1().").arg(m_tmp));
                    return;
                }
              ctrlstm2:
                if (m_invert) {
                    bogusTest(tokPtr, fL1S("Unexpected NOT operator in front of %1().").arg(m_tmp));
                    return;
                }
                finalizeTest(tokPtr);
                putBlock(tokPtr, uce, ptr - uce - 1); // Only for TokReturn
                putTok(tokPtr, defType);
                return;
            } else if (m_tmp == statics.stroption) {
                if (m_state != StNew || m_blockstack.top().braceLevel || m_blockstack.size() > 1
                        || m_invert || m_operator != NoOperator) {
                    bogusTest(tokPtr, fL1S("option() must appear outside any control structures."));
                    return;
                }
                if (*uce == (TokLiteral|TokNewStr)) {
                    uint nlen = uce[1];
                    if (uce[nlen + 2] == TokFuncTerminator) {
                        m_tmp.setRawData((QChar *)uce + 2, nlen);
                        if (m_tmp == statics.strhost_build)
                            m_proFile->setHostBuild(true);
                        else
                            parseError(fL1S("Unknown option() %1.").arg(m_tmp));
                        return;
                    }
                }
                parseError(fL1S("option() requires one literal argument."));
                return;
            }
        }
    }

    finalizeTest(tokPtr);
    putBlock(tokPtr, uc, ptr - uc);
}